

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void screen_reset(tgestate_t *state)

{
  tgestate_t *in_RDI;
  attribute_t in_stack_0000000f;
  tgestate_t *in_stack_00000010;
  tgestate_t *in_stack_00000030;
  
  wipe_visible_tiles((tgestate_t *)0x10af2e);
  plot_interior_tiles(in_RDI);
  zoombox(in_stack_00000010);
  plot_game_window(in_stack_00000030);
  set_game_window_attributes(in_stack_00000010,in_stack_0000000f);
  return;
}

Assistant:

void screen_reset(tgestate_t *state)
{
  assert(state != NULL);

  wipe_visible_tiles(state);
  plot_interior_tiles(state);
  zoombox(state);
  plot_game_window(state);
  set_game_window_attributes(state, attribute_WHITE_OVER_BLACK);
}